

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O3

void stealgold(monst *mtmp)

{
  short sVar1;
  bool bVar2;
  boolean bVar3;
  uint uVar4;
  obj *obj;
  ulong uVar5;
  long num;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  
  obj = gold_at(level,(int)u.ux,(int)u.uy);
  poVar6 = invent;
  if (obj == (obj *)0x0) {
    bVar2 = true;
  }
  else {
    do {
      bVar10 = obj->otyp == 0x1ef;
      bVar2 = !bVar10;
      if (bVar10) goto joined_r0x002561ac;
      obj = (obj->v).v_nexthere;
    } while (obj != (obj *)0x0);
  }
  obj = (obj *)0x0;
joined_r0x002561ac:
  do {
    if (poVar6 == (obj *)0x0) {
      poVar6 = (obj *)0x0;
LAB_002561c5:
      if (bVar2) {
        if (poVar6 == (obj *)0x0) {
          return;
        }
      }
      else if (((poVar6 == (obj *)0x0) || (poVar6->quan < obj->quan)) ||
              (uVar4 = mt_random(), uVar4 * -0x33333333 < 0x33333334)) {
        obj_extract_self(obj);
        add_to_minv(mtmp,obj);
        newsym((int)u.ux,(int)u.uy);
        pcVar7 = Monnam(mtmp);
        pcVar8 = body_part(5);
        pcVar8 = makeplural(pcVar8);
        pline("%s quickly snatches some gold from between your %s!",pcVar7,pcVar8);
        if ((poVar6 != (obj *)0x0) && (uVar4 = mt_random(), 0x33333333 < uVar4 * -0x33333333)) {
          return;
        }
        bVar3 = tele_restrict(mtmp);
        if (bVar3 == '\0') {
          rloc(level,mtmp,'\0');
        }
        monflee(mtmp,0,'\0','\0');
        return;
      }
      sVar1 = objects[0x1ef].oc_cost;
      uVar5 = money_cnt(invent);
      if (99 < (long)uVar5) {
        uVar9 = 10000;
        if (uVar5 < 10000) {
          uVar9 = uVar5;
        }
        uVar4 = mt_random();
        uVar5 = (ulong)((int)((ulong)uVar4 % (uVar9 & 0xffffffff)) + 1);
      }
      num = (long)(uVar5 + (long)sVar1 + -1) / (long)sVar1;
      if (num < poVar6->quan) {
        poVar6 = splitobj(poVar6,num);
      }
      freeinv(poVar6);
      add_to_minv(mtmp,poVar6);
      pline("Your purse feels lighter.");
      bVar3 = tele_restrict(mtmp);
      if (bVar3 == '\0') {
        rloc(level,mtmp,'\0');
      }
      monflee(mtmp,0,'\0','\0');
      iflags.botl = '\x01';
      return;
    }
    if (poVar6->otyp == 0x1ef) goto LAB_002561c5;
    poVar6 = poVar6->nobj;
  } while( true );
}

Assistant:

void stealgold(struct monst *mtmp)
{
	struct obj *fgold = gold_at(level, u.ux, u.uy);
	struct obj *ygold;
	long tmp;

        /* skip lesser coins on the floor */        
        while (fgold && fgold->otyp != GOLD_PIECE) fgold = fgold->nexthere; 

        /* Do you have real gold? */
        ygold = findgold(invent);

	if (fgold && ( !ygold || fgold->quan > ygold->quan || !rn2(5))) {
            obj_extract_self(fgold);
	    add_to_minv(mtmp, fgold);
	    newsym(u.ux, u.uy);
	    pline("%s quickly snatches some gold from between your %s!",
		    Monnam(mtmp), makeplural(body_part(FOOT)));
	    if (!ygold || !rn2(5)) {
		if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
		monflee(mtmp, 0, FALSE, FALSE);
	    }
	} else if (ygold) {
            const int gold_price = objects[GOLD_PIECE].oc_cost;
	    tmp = (somegold(money_cnt(invent)) + gold_price - 1) / gold_price;
	    tmp = min(tmp, ygold->quan);
            if (tmp < ygold->quan) ygold = splitobj(ygold, tmp);
            freeinv(ygold);
            add_to_minv(mtmp, ygold);
	    pline("Your purse feels lighter.");
	    if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
	    monflee(mtmp, 0, FALSE, FALSE);
	    iflags.botl = 1;
	}
}